

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O3

void ga_acc_twist_add(ga_acc_twist *xdd1,ga_acc_twist *xdd2,ga_acc_twist *r)

{
  frame *pfVar1;
  frame *pfVar2;
  point *ppVar3;
  point *ppVar4;
  body *pbVar5;
  
  if (xdd1 == (ga_acc_twist *)0x0) {
    __assert_fail("xdd1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x176,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (xdd2 == (ga_acc_twist *)0x0) {
    __assert_fail("xdd2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x177,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (r == (ga_acc_twist *)0x0) {
    __assert_fail("r",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x178,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  pfVar1 = xdd1->frame;
  if (pfVar1 == (frame *)0x0) {
    __assert_fail("xdd1->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x179,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  pfVar2 = xdd2->frame;
  if (pfVar2 == (frame *)0x0) {
    __assert_fail("xdd2->frame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x17a,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  ppVar3 = xdd1->point;
  if (ppVar3 == (point *)0x0) {
    __assert_fail("xdd1->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x17b,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  ppVar4 = xdd2->point;
  if (ppVar4 == (point *)0x0) {
    __assert_fail("xdd2->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x17c,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  if (ppVar3 == pfVar1->origin) {
    if (ppVar4 != pfVar2->origin) {
      __assert_fail("xdd2->point == xdd2->frame->origin",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0x17e,
                    "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                   );
    }
    if (xdd1->target_body != xdd2->target_body) {
      __assert_fail("xdd1->target_body == xdd2->target_body",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0x17f,
                    "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                   );
    }
    pbVar5 = xdd1->reference_body;
    if (pbVar5 != xdd2->reference_body) {
      __assert_fail("xdd1->reference_body == xdd2->reference_body",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0x180,
                    "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                   );
    }
    if (ppVar3 == ppVar4) {
      if (pfVar1 == pfVar2) {
        r->target_body = xdd1->target_body;
        r->reference_body = pbVar5;
        r->point = ppVar3;
        r->frame = pfVar1;
        return;
      }
      __assert_fail("xdd1->frame == xdd2->frame",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                    ,0x182,
                    "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                   );
    }
    __assert_fail("xdd1->point == xdd2->point",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                  ,0x181,
                  "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
                 );
  }
  __assert_fail("xdd1->point == xdd1->frame->origin",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,0x17d,
                "void ga_acc_twist_add(const struct ga_acc_twist *, const struct ga_acc_twist *, struct ga_acc_twist *)"
               );
}

Assistant:

void ga_acc_twist_add(
        const struct ga_acc_twist *xdd1,
        const struct ga_acc_twist *xdd2,
        struct ga_acc_twist *r)
{
    assert(xdd1);
    assert(xdd2);
    assert(r);
    assert(xdd1->frame);
    assert(xdd2->frame);
    assert(xdd1->point);
    assert(xdd2->point);
    assert(xdd1->point == xdd1->frame->origin);         // screw twist
    assert(xdd2->point == xdd2->frame->origin);         // screw twist
    assert(xdd1->target_body == xdd2->target_body);
    assert(xdd1->reference_body == xdd2->reference_body);
    assert(xdd1->point == xdd2->point);
    assert(xdd1->frame == xdd2->frame);

    r->target_body = xdd1->target_body;
    r->reference_body = xdd1->reference_body;
    r->point = xdd1->point;
    r->frame = xdd1->frame;
}